

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmCommand *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  cmSystemToolsFileTime *t;
  size_t sVar9;
  int iVar10;
  pointer pbVar11;
  uint uVar12;
  ulong uVar13;
  bool changed;
  string emsg;
  ostringstream e;
  bool local_229;
  pointer local_228;
  string local_220;
  cmCommand *local_200;
  pointer local_1f8;
  string local_1f0;
  pointer local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
    local_1f8 = (pointer)0x0;
    uVar13 = 1;
    uVar12 = 2;
    iVar10 = 0;
    local_228 = (pointer)0x0;
    local_1d0 = (pointer)0x0;
    local_200 = &this->super_cmCommand;
    do {
      iVar8 = std::__cxx11::string::compare((char *)(pbVar11 + uVar13));
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (iVar8 == 0) {
        iVar10 = 2;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)(pbVar11 + uVar13));
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (iVar8 == 0) {
          iVar10 = 3;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)(pbVar11 + uVar13));
          if (iVar8 == 0) {
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            iVar10 = 1;
          }
          else {
            if (iVar10 == 3) {
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_228 = pbVar11[uVar13]._M_dataplus._M_p;
            }
            else if (iVar10 == 2) {
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_1d0 = pbVar11[uVar13]._M_dataplus._M_p;
            }
            else {
              if (iVar10 != 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"RPATH_CHANGE given unknown argument ",0x24);
                pbVar11 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar11[uVar13]._M_dataplus._M_p,
                           pbVar11[uVar13]._M_string_length);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(local_200,&local_220);
                goto LAB_0027a7ee;
              }
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_1f8 = pbVar11[uVar13]._M_dataplus._M_p;
            }
            iVar10 = 0;
          }
        }
      }
      pcVar4 = local_1d0;
      pcVar3 = local_1f8;
      pcVar5 = local_200;
      uVar13 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar13 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ));
    this = (cmFileCommand *)local_200;
    if (local_1f8 != (char *)0x0) {
      if (local_1d0 == (char *)0x0) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"RPATH_CHANGE not given OLD_RPATH option.","");
        cmCommand::SetError(pcVar5,(string *)local_1a8);
      }
      else {
        if (local_228 != (pointer)0x0) {
          bVar6 = cmsys::SystemTools::FileExists(local_1f8,true);
          if (bVar6) {
            t = cmSystemTools::FileTimeNew();
            bVar6 = cmSystemTools::FileTimeGet(pcVar3,t);
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            local_220._M_string_length = 0;
            local_220.field_2._M_local_buf[0] = '\0';
            pcVar2 = local_1a8 + 0x10;
            local_1a8._0_8_ = pcVar2;
            sVar9 = strlen(pcVar3);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pcVar3,pcVar3 + sVar9);
            paVar1 = &local_1f0.field_2;
            local_1f0._M_dataplus._M_p = (pointer)paVar1;
            sVar9 = strlen(pcVar4);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,pcVar4,pcVar4 + sVar9);
            pcVar3 = local_228;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            sVar9 = strlen(local_228);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1c8,pcVar3,pcVar3 + sVar9);
            bVar7 = cmSystemTools::ChangeRPath
                              ((string *)local_1a8,&local_1f0,&local_1c8,&local_220,&local_229);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar3 = local_1f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((char *)local_1a8._0_8_ != pcVar2) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (bVar7) {
              if (local_229 == true) {
                local_1a8._0_8_ = pcVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"Set runtime path of \"","");
                std::__cxx11::string::append(local_1a8);
                std::__cxx11::string::append(local_1a8);
                std::__cxx11::string::append(local_1a8);
                std::__cxx11::string::append(local_1a8);
                cmMakefile::DisplayStatus(local_200->Makefile,(char *)local_1a8._0_8_,-1.0);
                if ((char *)local_1a8._0_8_ != pcVar2) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
              }
              if (bVar6) {
                cmSystemTools::FileTimeSet(pcVar3,t);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RPATH_CHANGE could not write new RPATH:\n",0x28);
              pcVar5 = local_200;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
              pcVar4 = local_228;
              sVar9 = strlen(local_228);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"to the file:\n",0xd);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
              sVar9 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(pcVar5,&local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != paVar1) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
            cmSystemTools::FileTimeDelete(t);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,
                              CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                       local_220.field_2._M_local_buf[0]) + 1);
              return bVar7;
            }
            return bVar7;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"RPATH_CHANGE given FILE \"",0x19);
          sVar9 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\" that does not exist.",0x16);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(pcVar5,&local_220);
LAB_0027a7ee:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,
                            CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                     local_220.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          return false;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"RPATH_CHANGE not given NEW_RPATH option.","");
        cmCommand::SetError(pcVar5,(string *)local_1a8);
      }
      goto LAB_0027a66f;
    }
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"RPATH_CHANGE not given FILE option.","");
  cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_0027a66f:
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool
cmFileCommand::HandleRPathChangeCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  const char* oldRPath = 0;
  const char* newRPath = 0;
  enum Doing { DoingNone, DoingFile, DoingOld, DoingNew };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "OLD_RPATH")
      {
      doing = DoingOld;
      }
    else if(args[i] == "NEW_RPATH")
      {
      doing = DoingNew;
      }
    else if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingOld)
      {
      oldRPath = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingNew)
      {
      newRPath = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
    }
  if(!oldRPath)
    {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
    }
  if(!newRPath)
    {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
    }
  if(!cmSystemTools::FileExists(file, true))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
    }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if(!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    this->SetError(e.str());
    success = false;
    }
  if(success)
    {
    if(changed)
      {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    if(have_ft)
      {
      cmSystemTools::FileTimeSet(file, ft);
      }
    }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}